

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(char lhs,
         SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  bool bVar1;
  uchar uVar2;
  undefined7 in_register_00000001;
  undefined1 in_SIL;
  undefined1 in_DIL;
  char ret;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  undefined5 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar6;
  undefined4 uVar5;
  long lVar3;
  uint6 uVar4;
  uchar *u;
  
  uVar5 = (undefined4)CONCAT21(CONCAT11((char)((uint7)in_register_00000001 >> 0x30),in_SIL),in_DIL);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *)&stack0xfffffffffffffffc);
  SVar6.m_int = (uchar)((uint)uVar5 >> 0x10);
  lVar3 = (ulong)CONCAT41(uVar5,SVar6.m_int) << 0x18;
  bVar1 = DivisionCornerCaseHelper<unsigned_char,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    ((char)((uint)uVar5 >> 8),SVar6,
                     (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffffc);
  if (bVar1) {
    uVar2 = (uchar)((ulong)lVar3 >> 0x20);
  }
  else {
    SVar6.m_int = (uchar)((ulong)lVar3 >> 0x30);
    uVar4 = CONCAT51((int5)((ulong)lVar3 >> 0x18),SVar6.m_int);
    bVar1 = DivisionCornerCaseHelper2<unsigned_char,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::DivisionCornerCase2
                      ((char)((ulong)lVar3 >> 0x28),SVar6,
                       (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)&stack0xfffffffffffffffc);
    if (bVar1) {
      uVar2 = (uchar)(uVar4 >> 0x10);
    }
    else {
      lVar3 = (ulong)uVar4 << 0x10;
      uVar2 = SafeInt::operator_cast_to_unsigned_char
                        ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)CONCAT17(unaff_retaddr_00,
                                     CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))));
      u = (uchar *)CONCAT71((int7)((ulong)lVar3 >> 8),uVar2);
      DivisionHelper<signed_char,unsigned_char,4>::
      DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                ((char *)CONCAT17(unaff_retaddr_00,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))),
                 u,(char *)0x12fc09);
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<signed_char>
                ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT17(unaff_retaddr_00,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))),
                 (char *)u);
      uVar2 = (uchar)((ulong)u >> 0x38);
    }
  }
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )uVar2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}